

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O3

String * __thiscall
Rml::StringUtilities::ToUTF8_abi_cxx11_
          (String *__return_storage_ptr__,StringUtilities *this,Character *characters,
          int num_characters)

{
  long lVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  byte local_49;
  byte local_48;
  byte local_47;
  byte local_46;
  byte local_45;
  byte local_44;
  byte local_43;
  byte local_42;
  byte local_41;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  ulong local_38;
  
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (0 < (int)characters) {
    local_38 = 0;
    uVar5 = 0;
    do {
      while( true ) {
        uVar4 = uVar5 + 1;
        uVar2 = *(uint *)(this + uVar4 * 4 + -4);
        if (0x7f < uVar2) break;
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
LAB_00265493:
        lVar1 = uVar5 + 2;
        uVar5 = uVar4;
        if (lVar1 - ((ulong)characters & 0xffffffff) == 1) {
          if ((local_38 & 1) == 0) {
            return __return_storage_ptr__;
          }
          goto LAB_002654c9;
        }
      }
      bVar3 = (byte)uVar2;
      if (uVar2 < 0x800) {
        local_49 = (byte)(uVar2 >> 6) | 0xc0;
        local_48 = bVar3 & 0x3f | 0x80;
        ::std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_49);
        goto LAB_00265493;
      }
      if (uVar2 < 0x10000) {
        local_47 = (byte)(uVar2 >> 0xc) | 0xe0;
        local_46 = (byte)(uVar2 >> 6) & 0x3f | 0x80;
        local_45 = bVar3 & 0x3f | 0x80;
        ::std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_47);
        goto LAB_00265493;
      }
      if (uVar2 < 0x110000) {
        local_44 = (byte)(uVar2 >> 0x12) | 0xf0;
        local_43 = (byte)(uVar2 >> 0xc) & 0x3f | 0x80;
        local_42 = (byte)(uVar2 >> 6) & 0x3f | 0x80;
        local_41 = bVar3 & 0x3f | 0x80;
        ::std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_44);
        goto LAB_00265493;
      }
      local_38 = CONCAT71((uint7)(uint3)(uVar2 >> 8),1);
      uVar5 = uVar4;
    } while (uVar4 != ((ulong)characters & 0xffffffff));
LAB_002654c9:
    Log::Message(LT_WARNING,"One or more invalid code points encountered while encoding to UTF-8.");
  }
  return __return_storage_ptr__;
}

Assistant:

String StringUtilities::ToUTF8(const Character* characters, int num_characters)
{
	String result;
	result.reserve(num_characters);

	bool invalid_character = false;

	for (int i = 0; i < num_characters; i++)
	{
		char32_t c = (char32_t)characters[i];

		constexpr int l3 = 0b0000'0111;
		constexpr int l4 = 0b0000'1111;
		constexpr int l5 = 0b0001'1111;
		constexpr int l6 = 0b0011'1111;
		constexpr int h1 = 0b1000'0000;
		constexpr int h2 = 0b1100'0000;
		constexpr int h3 = 0b1110'0000;
		constexpr int h4 = 0b1111'0000;

		if (c < 0x80)
			result += (char)c;
		else if (c < 0x800)
			result += {char(((c >> 6) & l5) | h2), char((c & l6) | h1)};
		else if (c < 0x10000)
			result += {char(((c >> 12) & l4) | h3), char(((c >> 6) & l6) | h1), char((c & l6) | h1)};
		else if (c <= 0x10FFFF)
			result += {char(((c >> 18) & l3) | h4), char(((c >> 12) & l6) | h1), char(((c >> 6) & l6) | h1), char((c & l6) | h1)};
		else
			invalid_character = true;
	}

	if (invalid_character)
		Log::Message(Log::LT_WARNING, "One or more invalid code points encountered while encoding to UTF-8.");

	return result;
}